

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_group(xml_parser *this,char_t *s,char_t endch)

{
  char in_DL;
  long in_RSI;
  xml_parser *in_RDI;
  size_t depth;
  long local_28;
  char_t *local_18;
  
  local_28 = 0;
  local_18 = (char_t *)(in_RSI + 2);
  while (*local_18 != '\0') {
    if (((*local_18 == '<') && (local_18[1] == '!')) && (local_18[2] != '-')) {
      if (local_18[2] == '[') {
        local_18 = parse_doctype_ignore(in_RDI,local_18);
        if (local_18 == (char_t *)0x0) {
          return (char_t *)0x0;
        }
      }
      else {
        local_18 = local_18 + 2;
        local_28 = local_28 + 1;
      }
    }
    else if (((*local_18 == '<') || (*local_18 == '\"')) || (*local_18 == '\'')) {
      local_18 = parse_doctype_primitive(in_RDI,local_18);
      if (local_18 == (char_t *)0x0) {
        return (char_t *)0x0;
      }
    }
    else {
      if (*local_18 == '>') {
        if (local_28 == 0) {
          return local_18;
        }
        local_28 = local_28 + -1;
      }
      local_18 = local_18 + 1;
    }
  }
  if ((local_28 == 0) && (in_DL == '>')) {
    return local_18;
  }
  in_RDI->error_offset = local_18;
  in_RDI->error_status = status_bad_doctype;
  return (char_t *)0x0;
}

Assistant:

char_t* parse_doctype_group(char_t* s, char_t endch)
		{
			size_t depth = 0;

			assert((s[0] == '<' || s[0] == 0) && s[1] == '!');
			s += 2;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] != '-')
				{
					if (s[2] == '[')
					{
						// ignore
						s = parse_doctype_ignore(s);
						if (!s) return s;
					}
					else
					{
						// some control group
						s += 2;
						depth++;
					}
				}
				else if (s[0] == '<' || s[0] == '"' || s[0] == '\'')
				{
					// unknown tag (forbidden), or some primitive group
					s = parse_doctype_primitive(s);
					if (!s) return s;
				}
				else if (*s == '>')
				{
					if (depth == 0)
						return s;

					depth--;
					s++;
				}
				else s++;
			}

			if (depth != 0 || endch != '>') PUGI_IMPL_THROW_ERROR(status_bad_doctype, s);

			return s;
		}